

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CColorConverter.cpp
# Opt level: O1

void irr::video::CColorConverter::convert16bitToA8R8G8B8andResize
               (s16 *in,s32 *out,s32 newWidth,s32 newHeight,s32 currentWidth,s32 currentHeight)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  float fVar5;
  
  if ((newHeight != 0 && newWidth != 0) && (0 < newWidth)) {
    uVar2 = 0;
    do {
      if (0 < newHeight) {
        fVar5 = 0.0;
        piVar1 = out;
        uVar3 = (ulong)(uint)newHeight;
        do {
          uVar4 = (uint)in[(int)((float)((int)fVar5 * currentWidth) +
                                (float)(int)uVar2 * ((float)currentWidth / (float)newWidth))];
          *piVar1 = ((uVar4 & 0x3e0) << 6 | (uVar4 & 0x7c00) << 9 | uVar4 & 0x80000000) +
                    (uVar4 & 0x1f) * 8;
          fVar5 = fVar5 + (float)currentHeight / (float)newHeight;
          piVar1 = piVar1 + (uint)newWidth;
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
      }
      uVar2 = uVar2 + 1;
      out = out + 1;
    } while (uVar2 != (uint)newWidth);
  }
  return;
}

Assistant:

void CColorConverter::convert16bitToA8R8G8B8andResize(const s16 *in, s32 *out, s32 newWidth, s32 newHeight, s32 currentWidth, s32 currentHeight)
{
	if (!newWidth || !newHeight)
		return;

	// note: this is very very slow. (i didn't want to write a fast version.
	// but hopefully, nobody wants to convert surfaces every frame.

	f32 sourceXStep = (f32)currentWidth / (f32)newWidth;
	f32 sourceYStep = (f32)currentHeight / (f32)newHeight;
	f32 sy;
	s32 t;

	for (s32 x = 0; x < newWidth; ++x) {
		sy = 0.0f;

		for (s32 y = 0; y < newHeight; ++y) {
			t = in[(s32)(((s32)sy) * currentWidth + x * sourceXStep)];
			t = (((t >> 15) & 0x1) << 31) | (((t >> 10) & 0x1F) << 19) |
				(((t >> 5) & 0x1F) << 11) | (t & 0x1F) << 3;
			out[(s32)(y * newWidth + x)] = t;

			sy += sourceYStep;
		}
	}
}